

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.h
# Opt level: O0

int64_t scaled_buffer_offset(int x_offset,int y_offset,int stride,scale_factors *sf)

{
  int iVar1;
  scale_factors *in_RCX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int y;
  int x;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (in_RCX != (scale_factors *)0x0) {
    iVar1 = av1_is_scaled((scale_factors *)
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (iVar1 == 0) {
      iVar1 = av1_unscaled_value(in_EDI,in_RCX);
      in_EDI = iVar1 >> 6;
      iVar1 = av1_unscaled_value(in_ESI,in_RCX);
    }
    else {
      iVar1 = av1_scaled_x(in_EDI,in_RCX);
      in_EDI = iVar1 >> 6;
      iVar1 = av1_scaled_y(in_ESI,in_RCX);
    }
    in_ESI = iVar1 >> 6;
  }
  return (long)in_ESI * (long)in_EDX + (long)in_EDI;
}

Assistant:

static inline int64_t scaled_buffer_offset(int x_offset, int y_offset,
                                           int stride,
                                           const struct scale_factors *sf) {
  int x, y;
  if (!sf) {
    x = x_offset;
    y = y_offset;
  } else if (av1_is_scaled(sf)) {
    x = av1_scaled_x(x_offset, sf) >> SCALE_EXTRA_BITS;
    y = av1_scaled_y(y_offset, sf) >> SCALE_EXTRA_BITS;
  } else {
    x = av1_unscaled_value(x_offset, sf) >> SCALE_EXTRA_BITS;
    y = av1_unscaled_value(y_offset, sf) >> SCALE_EXTRA_BITS;
  }
  return (int64_t)y * stride + x;
}